

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O0

SUNErrCode SUNMemoryHelper_Dealloc_Sys(SUNMemoryHelper helper,SUNMemory mem,void *queue)

{
  long *in_RSI;
  long *in_RDI;
  SUNContext sunctx_local_scope_;
  
  if (in_RSI != (long *)0x0) {
    if (((*in_RSI != 0) && (*(int *)((long)in_RSI + 0xc) != 0)) && ((int)in_RSI[1] == 0)) {
      *(long *)(*in_RDI + 8) = *(long *)(*in_RDI + 8) + 1;
      *(long *)(*in_RDI + 0x10) = *(long *)(*in_RDI + 0x10) - in_RSI[2];
      free((void *)*in_RSI);
      *in_RSI = 0;
    }
    free(in_RSI);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Dealloc_Sys(SUNMemoryHelper helper, SUNMemory mem,
                                       SUNDIALS_MAYBE_UNUSED void* queue)
{
  SUNFunctionBegin(helper->sunctx);

  if (mem == NULL) { return SUN_SUCCESS; }

  SUNAssert(mem->type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);

  if (mem->ptr != NULL && mem->own)
  {
    if (mem->type == SUNMEMTYPE_HOST)
    {
      SUNHELPER_CONTENT(helper)->num_deallocations++;
      SUNHELPER_CONTENT(helper)->bytes_allocated -= mem->bytes;
      free(mem->ptr);
      mem->ptr = NULL;
    }
  }

  free(mem);
  return SUN_SUCCESS;
}